

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  AV1_PRIMARY *ppi_00;
  AV1_COMP *pAVar1;
  uint *puVar2;
  LAYER_CONTEXT *pLVar3;
  _Bool _Var4;
  int iVar5;
  aom_codec_err_t aVar6;
  uint *in_RSI;
  long in_RDI;
  SequenceHeader *seq_params_1;
  AV1EncoderConfig *oxcf;
  int layer_target_bitrate;
  LAYER_CONTEXT *lc;
  int layer_1;
  int layer;
  int num_layers;
  uint tl;
  uint sl;
  SequenceHeader *seq_params;
  int64_t target_bandwidth;
  aom_svc_params_t *params;
  AV1_COMP *cpi;
  AV1_PRIMARY *ppi;
  uint local_c8;
  uint local_c4;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int local_b0;
  int local_ac;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar7;
  int local_50;
  uint in_stack_ffffffffffffffb8;
  uint uVar8;
  AV1_COMP *in_stack_ffffffffffffffc0;
  int64_t local_38;
  
  ppi_00 = *(AV1_PRIMARY **)(in_RDI + 0xb50);
  pAVar1 = ppi_00->cpi;
  uVar7 = *in_RSI;
  if (uVar7 < 0x29) {
    local_90 = (undefined8 *)((long)(int)uVar7 + *(long *)(in_RSI + 4));
    *in_RSI = uVar7 + 8;
  }
  else {
    local_90 = *(undefined8 **)(in_RSI + 2);
    *(undefined8 **)(in_RSI + 2) = local_90 + 1;
  }
  puVar2 = (uint *)*local_90;
  local_38 = 0;
  ppi_00->number_spatial_layers = *puVar2;
  ppi_00->number_temporal_layers = puVar2[1];
  (pAVar1->svc).number_spatial_layers = *puVar2;
  (pAVar1->svc).number_temporal_layers = puVar2[1];
  if ((((pAVar1->svc).prev_number_temporal_layers != 0) &&
      ((pAVar1->svc).prev_number_spatial_layers != 0)) &&
     (((pAVar1->svc).number_temporal_layers != (pAVar1->svc).prev_number_temporal_layers ||
      ((pAVar1->svc).number_spatial_layers != (pAVar1->svc).prev_number_spatial_layers)))) {
    in_stack_ffffffffffffffc0 = (AV1_COMP *)&ppi_00->seq_params;
    (ppi_00->seq_params).operating_points_cnt_minus_1 =
         ppi_00->number_spatial_layers * ppi_00->number_temporal_layers + -1;
    *(ulong *)(in_RDI + 0xc18) = *(ulong *)(in_RDI + 0xc18) | 1;
    av1_set_svc_seq_params(ppi_00);
    if ((pAVar1->svc).spatial_layer_id < (pAVar1->svc).number_spatial_layers + -1) {
      local_94 = (pAVar1->svc).spatial_layer_id;
    }
    else {
      local_94 = (pAVar1->svc).number_spatial_layers + -1;
    }
    if (local_94 < 0) {
      local_98 = 0;
    }
    else {
      if ((pAVar1->svc).spatial_layer_id < (pAVar1->svc).number_spatial_layers + -1) {
        local_9c = (pAVar1->svc).spatial_layer_id;
      }
      else {
        local_9c = (pAVar1->svc).number_spatial_layers + -1;
      }
      local_98 = local_9c;
    }
    (pAVar1->svc).spatial_layer_id = local_98;
    if ((pAVar1->svc).temporal_layer_id < (pAVar1->svc).number_temporal_layers + -1) {
      local_a0 = (pAVar1->svc).temporal_layer_id;
    }
    else {
      local_a0 = (pAVar1->svc).number_temporal_layers + -1;
    }
    if (local_a0 < 0) {
      in_stack_ffffffffffffff5c = 0;
    }
    else if ((pAVar1->svc).temporal_layer_id < (pAVar1->svc).number_temporal_layers + -1) {
      in_stack_ffffffffffffff58 = (pAVar1->svc).temporal_layer_id;
      in_stack_ffffffffffffff5c = in_stack_ffffffffffffff58;
    }
    else {
      in_stack_ffffffffffffff58 = (pAVar1->svc).number_temporal_layers + -1;
      in_stack_ffffffffffffff5c = in_stack_ffffffffffffff58;
    }
    (pAVar1->svc).temporal_layer_id = in_stack_ffffffffffffff5c;
    if ((pAVar1->common).spatial_layer_id < (pAVar1->svc).number_spatial_layers + -1) {
      local_ac = (pAVar1->common).spatial_layer_id;
    }
    else {
      local_ac = (pAVar1->svc).number_spatial_layers + -1;
    }
    if (local_ac < 0) {
      local_b0 = 0;
    }
    else if ((pAVar1->common).spatial_layer_id < (pAVar1->svc).number_spatial_layers + -1) {
      in_stack_ffffffffffffff4c = (pAVar1->common).spatial_layer_id;
      local_b0 = in_stack_ffffffffffffff4c;
    }
    else {
      in_stack_ffffffffffffff4c = (pAVar1->svc).number_spatial_layers + -1;
      local_b0 = in_stack_ffffffffffffff4c;
    }
    (pAVar1->common).spatial_layer_id = local_b0;
    if ((pAVar1->common).temporal_layer_id < (pAVar1->svc).number_temporal_layers + -1) {
      in_stack_ffffffffffffff48 = (pAVar1->common).temporal_layer_id;
    }
    else {
      in_stack_ffffffffffffff48 = (pAVar1->svc).number_temporal_layers + -1;
    }
    if (in_stack_ffffffffffffff48 < 0) {
      in_stack_ffffffffffffff44 = 0;
    }
    else if ((pAVar1->common).temporal_layer_id < (pAVar1->svc).number_temporal_layers + -1) {
      in_stack_ffffffffffffff40 = (pAVar1->common).temporal_layer_id;
      in_stack_ffffffffffffff44 = in_stack_ffffffffffffff40;
    }
    else {
      in_stack_ffffffffffffff40 = (pAVar1->svc).number_temporal_layers + -1;
      in_stack_ffffffffffffff44 = in_stack_ffffffffffffff40;
    }
    (pAVar1->common).temporal_layer_id = in_stack_ffffffffffffff44;
  }
  if ((ppi_00->number_spatial_layers < 2) && (ppi_00->number_temporal_layers < 2)) {
    if (ppi_00->seq_params_locked == 0) {
      aVar6 = update_encoder_cfg((aom_codec_alg_priv_t_conflict *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      return aVar6;
    }
  }
  else {
    *(undefined4 *)(*(long *)(in_RDI + 0xb50) + 0xc750) = 1;
    for (local_50 = 0;
        local_50 < (int)(ppi_00->number_spatial_layers * ppi_00->number_temporal_layers);
        local_50 = local_50 + 1) {
      if (((0x3f < (int)puVar2[(long)local_50 + 2]) || ((int)puVar2[(long)local_50 + 0x22] < 0)) ||
         ((int)puVar2[(long)local_50 + 2] < (int)puVar2[(long)local_50 + 0x22])) {
        return AOM_CODEC_INVALID_PARAM;
      }
    }
    _Var4 = av1_alloc_layer_context
                      ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff44);
    if (!_Var4) {
      return AOM_CODEC_MEM_ERROR;
    }
    for (uVar8 = 0; uVar8 < ppi_00->number_spatial_layers; uVar8 = uVar8 + 1) {
      for (in_stack_ffffffffffffffb8 = 0; in_stack_ffffffffffffffb8 < ppi_00->number_temporal_layers
          ; in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1) {
        iVar5 = uVar8 * ppi_00->number_temporal_layers + in_stack_ffffffffffffffb8;
        pLVar3 = (pAVar1->svc).layer_context;
        pLVar3[iVar5].max_q = puVar2[(long)iVar5 + 2];
        pLVar3[iVar5].min_q = puVar2[(long)iVar5 + 0x22];
        if ((int)puVar2[(ulong)uVar8 + 0x42] < 1) {
          local_c4 = 1;
        }
        else {
          local_c4 = puVar2[(ulong)uVar8 + 0x42];
        }
        pLVar3[iVar5].scaling_factor_num = local_c4;
        if ((int)puVar2[(ulong)uVar8 + 0x46] < 1) {
          local_c8 = 1;
        }
        else {
          local_c8 = puVar2[(ulong)uVar8 + 0x46];
        }
        pLVar3[iVar5].scaling_factor_den = local_c8;
        if ((int)puVar2[(long)iVar5 + 0x4a] < 0x20c49c) {
          pLVar3[iVar5].layer_target_bitrate = (long)(int)(puVar2[(long)iVar5 + 0x4a] * 1000);
        }
        else {
          pLVar3[iVar5].layer_target_bitrate = 0x7fffffff;
        }
        pLVar3[iVar5].framerate_factor = puVar2[(ulong)in_stack_ffffffffffffffb8 + 0x6a];
        if (in_stack_ffffffffffffffb8 == ppi_00->number_temporal_layers - 1) {
          local_38 = pLVar3[iVar5].layer_target_bitrate + local_38;
        }
      }
    }
    if (ppi_00->seq_params_locked == 0) {
      (pAVar1->oxcf).rc_cfg.target_bandwidth = local_38;
      *(int64_t *)(in_RDI + 0x758) = local_38;
      (ppi_00->seq_params).operating_points_cnt_minus_1 =
           ppi_00->number_spatial_layers * ppi_00->number_temporal_layers + -1;
      av1_init_layer_context((AV1_COMP *)CONCAT44(uVar7,in_stack_ffffffffffffff80));
      aVar6 = update_encoder_cfg((aom_codec_alg_priv_t_conflict *)
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      return aVar6;
    }
    (pAVar1->oxcf).rc_cfg.target_bandwidth = local_38;
    *(int64_t *)(in_RDI + 0x758) = local_38;
    set_primary_rc_buffer_sizes(&pAVar1->oxcf,ppi_00);
    av1_update_layer_context_change_config
              (in_stack_ffffffffffffffc0,CONCAT44(uVar8,in_stack_ffffffffffffffb8));
    check_reset_rc_flag((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  av1_check_fpmt_config
            ((AV1_PRIMARY *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
             (AV1EncoderConfig *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_params(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  aom_svc_params_t *const params = va_arg(args, aom_svc_params_t *);
  int64_t target_bandwidth = 0;
  ppi->number_spatial_layers = params->number_spatial_layers;
  ppi->number_temporal_layers = params->number_temporal_layers;
  cpi->svc.number_spatial_layers = params->number_spatial_layers;
  cpi->svc.number_temporal_layers = params->number_temporal_layers;
  // Sequence parameters (operating_points_cnt_minus_1, operating_point_idc[])
  // need to be updated if the number of layers have changed.
  // Force a keyframe here and update the two relevant sequence parameters.
  if (cpi->svc.prev_number_temporal_layers &&
      cpi->svc.prev_number_spatial_layers &&
      (cpi->svc.number_temporal_layers !=
           cpi->svc.prev_number_temporal_layers ||
       cpi->svc.number_spatial_layers != cpi->svc.prev_number_spatial_layers)) {
    SequenceHeader *const seq_params = &ppi->seq_params;
    seq_params->operating_points_cnt_minus_1 =
        ppi->number_spatial_layers * ppi->number_temporal_layers - 1;
    ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;
    av1_set_svc_seq_params(ppi);
    // Check for valid values for the spatial/temporal_layer_id here, since
    // there has been a dynamic change in the number_spatial/temporal_layers,
    // and if the ctrl_set_layer_id is not used after this call, the
    // previous (last_encoded) values of spatial/temporal_layer_id will be used,
    // which may be invalid.
    cpi->svc.spatial_layer_id = AOMMAX(
        0,
        AOMMIN(cpi->svc.spatial_layer_id, cpi->svc.number_spatial_layers - 1));
    cpi->svc.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->svc.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
    cpi->common.spatial_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.spatial_layer_id,
                         cpi->svc.number_spatial_layers - 1));
    cpi->common.temporal_layer_id =
        AOMMAX(0, AOMMIN(cpi->common.temporal_layer_id,
                         cpi->svc.number_temporal_layers - 1));
  }

  if (ppi->number_spatial_layers > 1 || ppi->number_temporal_layers > 1) {
    unsigned int sl, tl;
    ctx->ppi->use_svc = 1;
    const int num_layers =
        ppi->number_spatial_layers * ppi->number_temporal_layers;
    for (int layer = 0; layer < num_layers; ++layer) {
      if (params->max_quantizers[layer] > 63 ||
          params->min_quantizers[layer] < 0 ||
          params->min_quantizers[layer] > params->max_quantizers[layer]) {
        return AOM_CODEC_INVALID_PARAM;
      }
    }
    if (!av1_alloc_layer_context(cpi, num_layers)) return AOM_CODEC_MEM_ERROR;

    for (sl = 0; sl < ppi->number_spatial_layers; ++sl) {
      for (tl = 0; tl < ppi->number_temporal_layers; ++tl) {
        const int layer = LAYER_IDS_TO_IDX(sl, tl, ppi->number_temporal_layers);
        LAYER_CONTEXT *lc = &cpi->svc.layer_context[layer];
        lc->max_q = params->max_quantizers[layer];
        lc->min_q = params->min_quantizers[layer];
        lc->scaling_factor_num = AOMMAX(1, params->scaling_factor_num[sl]);
        lc->scaling_factor_den = AOMMAX(1, params->scaling_factor_den[sl]);
        const int layer_target_bitrate = params->layer_target_bitrate[layer];
        if (layer_target_bitrate > INT_MAX / 1000) {
          lc->layer_target_bitrate = INT_MAX;
        } else {
          lc->layer_target_bitrate = 1000 * layer_target_bitrate;
        }
        lc->framerate_factor = params->framerate_factor[tl];
        if (tl == ppi->number_temporal_layers - 1)
          target_bandwidth += lc->layer_target_bitrate;
      }
    }

    if (ppi->seq_params_locked) {
      AV1EncoderConfig *const oxcf = &cpi->oxcf;
      // Keep ctx->oxcf in sync in case further codec controls are made prior
      // to encoding.
      ctx->oxcf.rc_cfg.target_bandwidth = oxcf->rc_cfg.target_bandwidth =
          target_bandwidth;
      set_primary_rc_buffer_sizes(oxcf, ppi);
      av1_update_layer_context_change_config(cpi, target_bandwidth);
      check_reset_rc_flag(cpi);
    } else {
      // Note av1_init_layer_context() relies on cpi->oxcf. The order of that
      // call and the ones in the other half of this block (which
      // update_encoder_cfg() transitively makes) is important. So we keep
      // ctx->oxcf and cpi->oxcf in sync here as update_encoder_cfg() will
      // overwrite cpi->oxcf with ctx->oxcf.
      ctx->oxcf.rc_cfg.target_bandwidth = cpi->oxcf.rc_cfg.target_bandwidth =
          target_bandwidth;
      SequenceHeader *const seq_params = &ppi->seq_params;
      seq_params->operating_points_cnt_minus_1 =
          ppi->number_spatial_layers * ppi->number_temporal_layers - 1;

      av1_init_layer_context(cpi);
      // update_encoder_cfg() is somewhat costly and this control may be called
      // multiple times, so update_encoder_cfg() is only called to ensure frame
      // and superblock sizes are updated before they're fixed by the first
      // encode call.
      return update_encoder_cfg(ctx);
    }
  } else if (!ppi->seq_params_locked) {
    // Ensure frame and superblock sizes are updated.
    return update_encoder_cfg(ctx);
  }
  av1_check_fpmt_config(ctx->ppi, &ctx->ppi->cpi->oxcf);
  return AOM_CODEC_OK;
}